

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O0

StridedValueAccess<64> * __thiscall
rsg::StridedValueAccess<64>::operator=(StridedValueAccess<64> *this,StridedValueRead<64> *valueRead)

{
  int iVar1;
  VariableType *this_00;
  Scalar *__first;
  Scalar *pSVar2;
  int scalarSize;
  StridedValueRead<64> *valueRead_local;
  StridedValueAccess<64> *this_local;
  
  this_00 = ConstStridedValueAccess<64>::getType(&this->super_ConstStridedValueAccess<64>);
  iVar1 = VariableType::getScalarSize(this_00);
  if (iVar1 != 0) {
    __first = StridedValueRead<64>::getValuePtr(valueRead);
    pSVar2 = StridedValueRead<64>::getValuePtr(valueRead);
    std::copy<rsg::Scalar_const*,rsg::Scalar*>
              (__first,pSVar2 + (iVar1 << 6),(this->super_ConstStridedValueAccess<64>).m_value);
  }
  return this;
}

Assistant:

StridedValueAccess<Stride>& StridedValueAccess<Stride>::operator= (const StridedValueRead<SrcStride>& valueRead)
{
	DE_STATIC_ASSERT(SrcStride == Stride || SrcStride == 1);
	DE_ASSERT(this->getType() == valueRead.getType());

	int scalarSize = this->getType().getScalarSize();

	if (scalarSize == 0)
		return *this; // Happens when void value range is copied

	if (Stride == SrcStride)
		std::copy(valueRead.getValuePtr(), valueRead.getValuePtr() + scalarSize*Stride, this->m_value);
	else
	{
		for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			std::fill(this->m_value + scalarNdx*Stride, this->m_value + (scalarNdx+1)*Stride, valueRead.getValuePtr()[scalarNdx]);
	}

	return *this;
}